

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void fmt::v6::internal::
     value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
     ::format_custom_arg<Query,fmt::v6::internal::fallback_formatter<Query,char,void>>
               (void *arg,
               basic_format_parse_context<char,_fmt::v6::internal::error_handler> *parse_ctx,
               basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>
               *ctx)

{
  iterator it;
  basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char> *in_RDX;
  basic_format_parse_context<char,_fmt::v6::internal::error_handler> *in_stack_00000018;
  fallback_formatter<Query,_char,_void> f;
  basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>
  *in_stack_00000208;
  Query *in_stack_00000210;
  fallback_formatter<Query,_char,_void> *in_stack_00000218;
  iterator in_stack_ffffffffffffff98;
  basic_format_parse_context<char,_fmt::v6::internal::error_handler> *in_stack_ffffffffffffffa0;
  
  fallback_formatter<Query,_char,_void>::fallback_formatter
            ((fallback_formatter<Query,_char,_void> *)0x18062d);
  formatter<fmt::v6::basic_string_view<char>,char,void>::
  parse<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>>
            ((formatter<fmt::v6::basic_string_view<char>,_char,_void> *)
             f.super_formatter<fmt::v6::basic_string_view<char>,_char,_void>.specs_.
             super_basic_format_specs<char>._0_8_,in_stack_00000018);
  basic_format_parse_context<char,_fmt::v6::internal::error_handler>::advance_to
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  it = fallback_formatter<Query,char,void>::
       format<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                 (in_stack_00000218,in_stack_00000210,in_stack_00000208);
  basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>::
  advance_to(in_RDX,it);
  return;
}

Assistant:

static void format_custom_arg(
      const void* arg, basic_format_parse_context<char_type>& parse_ctx,
      Context& ctx) {
    Formatter f;
    parse_ctx.advance_to(f.parse(parse_ctx));
    ctx.advance_to(f.format(*static_cast<const T*>(arg), ctx));
  }